

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall
wabt::FileStream::FileStream(FileStream *this,string_view filename,Stream *log_stream)

{
  FILE *pFVar1;
  string filename_str;
  string local_40;
  string_view local_20;
  
  local_20.size_ = filename.size_;
  local_20.data_ = filename.data_;
  (this->super_Stream).offset_ = 0;
  (this->super_Stream).result_.enum_ = Ok;
  (this->super_Stream).log_stream_ = log_stream;
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__FileStream_0020d398;
  this->file_ = (FILE *)0x0;
  this->offset_ = 0;
  this->should_close_ = false;
  string_view::to_string_abi_cxx11_(&local_40,&local_20);
  pFVar1 = fopen(local_40._M_dataplus._M_p,"wb");
  this->file_ = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    wabt::FileStream((wabt *)&local_40);
  }
  else {
    this->should_close_ = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

FileStream::FileStream(string_view filename, Stream* log_stream)
    : Stream(log_stream), file_(nullptr), offset_(0), should_close_(false) {
  std::string filename_str = filename.to_string();
  file_ = fopen(filename_str.c_str(), "wb");

  // TODO(binji): this is pretty cheesy, should come up with a better API.
  if (file_) {
    should_close_ = true;
  } else {
    ERROR("fopen name=\"%s\" failed, errno=%d\n", filename_str.c_str(), errno);
  }
}